

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O3

void Abc_NtkLatchPipe(Abc_Ntk_t *pNtk,int nLatches)

{
  Abc_Obj_t *pNode;
  bool bVar1;
  uint uVar2;
  Vec_Ptr_t *vNodes;
  void **__ptr;
  Abc_Obj_t *pObj;
  char *pName;
  long lVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  uint nDigits;
  int Num;
  int iVar6;
  Abc_Obj_t *pFanin;
  int iVar7;
  
  if (nLatches < 1) {
    return;
  }
  pVVar4 = pNtk->vPis;
  iVar6 = pVVar4->nSize;
  nDigits = iVar6 * nLatches;
  if (1 < nDigits) {
    uVar2 = nDigits - 1;
    nDigits = 0;
    do {
      nDigits = nDigits + 1;
      bVar1 = 9 < uVar2;
      uVar2 = uVar2 / 10;
    } while (bVar1);
  }
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  __ptr = (void **)malloc(800);
  vNodes->pArray = __ptr;
  if (0 < iVar6) {
    iVar6 = 0;
    lVar3 = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar4->pArray[lVar3];
      Abc_NodeCollectFanouts(pNode,vNodes);
      pFanin = pNode;
      iVar7 = nLatches;
      Num = iVar6;
      do {
        pObj = Abc_NtkCreateObj(pNtk,ABC_OBJ_LATCH);
        Abc_ObjAddFanin(pObj,pFanin);
        if ((*(uint *)&pObj->field_0x14 & 0xf) != 8) {
          __assert_fail("Abc_ObjIsLatch(pLatch)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                        ,0x1a6,"void Abc_LatchSetInitDc(Abc_Obj_t *)");
        }
        pObj->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x3;
        pName = Abc_ObjNameDummy("LL",Num,nDigits);
        Abc_ObjAssignName(pObj,pName,(char *)0x0);
        Num = Num + 1;
        iVar7 = iVar7 + -1;
        pFanin = pObj;
      } while (iVar7 != 0);
      if (0 < vNodes->nSize) {
        lVar5 = 0;
        do {
          Abc_ObjPatchFanin((Abc_Obj_t *)vNodes->pArray[lVar5],pNode,pObj);
          lVar5 = lVar5 + 1;
        } while (lVar5 < vNodes->nSize);
      }
      lVar3 = lVar3 + 1;
      pVVar4 = pNtk->vPis;
      iVar6 = iVar6 + nLatches;
    } while (lVar3 < pVVar4->nSize);
    __ptr = vNodes->pArray;
  }
  if (__ptr != (void **)0x0) {
    free(__ptr);
  }
  free(vNodes);
  Abc_NtkLogicMakeSimpleCos(pNtk,0);
  return;
}

Assistant:

void Abc_NtkLatchPipe( Abc_Ntk_t * pNtk, int nLatches )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pLatch, * pFanin, * pFanout;
    int i, k, nTotal, nDigits;
    if ( nLatches < 1 )
        return;
    nTotal = nLatches * Abc_NtkPiNum(pNtk);
    nDigits = Abc_Base10Log( nTotal );
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NtkForEachPi( pNtk, pObj, i )
    {
        // remember current fanins of the PI
        Abc_NodeCollectFanouts( pObj, vNodes );
        // create the latches
        for ( pFanin = pObj, k = 0; k < nLatches; k++, pFanin = pLatch )
        {
            pLatch = Abc_NtkCreateLatch( pNtk );
            Abc_ObjAddFanin( pLatch, pFanin );
            Abc_LatchSetInitDc( pLatch );
            // create the name of the new latch
            Abc_ObjAssignName( pLatch, Abc_ObjNameDummy("LL", i*nLatches + k, nDigits), NULL );
        }
        // patch the PI fanouts
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pFanout, k )
            Abc_ObjPatchFanin( pFanout, pObj, pFanin );
    }
    Vec_PtrFree( vNodes );
    Abc_NtkLogicMakeSimpleCos( pNtk, 0 );
}